

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int automataTest(char *filename,char *result,char *err,int options)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  FILE *__stream;
  char *__filename;
  char *pcVar6;
  size_t sVar7;
  xmlAutomataStatePtr pxVar8;
  xmlAutomataStatePtr pxVar9;
  byte bVar10;
  ulong uVar11;
  xmlAutomataStatePtr pxVar12;
  long lVar13;
  size_t sStackY_3360;
  char *ptr;
  long local_3348;
  long local_3340;
  char *local_3338;
  long local_3330;
  FILE *local_3328;
  undefined8 local_3320;
  xmlAutomataStatePtr local_3318;
  undefined8 local_3310;
  char expr [5000];
  xmlAutomataStatePtr states [1000];
  
  nb_tests = nb_tests + 1;
  for (lVar5 = 0; lVar5 != 1000; lVar5 = lVar5 + 1) {
    states[lVar5] = (xmlAutomataStatePtr)0x0;
  }
  __stream = fopen64(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Cannot open %s for reading\n",filename);
  }
  else {
    __filename = resultFilename(filename,"",".res");
    if (__filename == (char *)0x0) {
      fwrite("Out of memory\n",0xe,1,_stderr);
      fatalError();
    }
    local_3328 = fopen64(__filename,"wb");
    if (local_3328 == (FILE *)0x0) {
      fprintf(_stderr,"failed to open output file %s\n",__filename);
      free(__filename);
    }
    else {
      lVar5 = xmlNewAutomata();
      if (lVar5 == 0) {
        fwrite("Cannot create automata\n",0x17,1,_stderr);
      }
      else {
        states[0] = (xmlAutomataStatePtr)xmlAutomataGetInitState(lVar5);
        if (states[0] != (xmlAutomataStatePtr)0x0) {
          local_3330 = 0;
          local_3338 = result;
          local_3310 = filename;
LAB_0010b6d9:
          local_3348 = 0;
LAB_0010b6e2:
          local_3320 = 0;
LAB_0010b6eb:
          do {
            do {
              pcVar6 = fgets(expr,0x1194,__stream);
              cVar1 = expr[0];
              if (pcVar6 == (char *)0x0) {
LAB_0010bd0a:
                pcVar6 = local_3338;
                fclose(local_3328);
                fclose(__stream);
                lVar13 = local_3330;
                if (local_3348 != 0) {
                  xmlRegFreeRegexp();
                }
                if (lVar13 != 0) {
                  xmlRegFreeExecCtxt(lVar13);
                }
                if (lVar5 != 0) {
                  xmlFreeAutomata(lVar5);
                }
                iVar2 = compareFiles(__filename,pcVar6);
                if (iVar2 != 0) {
                  fprintf(_stderr,"Result for %s failed in %s\n",local_3310,pcVar6);
                }
                unlink(__filename);
                free(__filename);
                return (uint)(iVar2 != 0);
              }
            } while (expr[0] == '#');
            sVar7 = strlen(expr);
            pcVar6 = expr + (int)sVar7;
            for (uVar11 = sVar7 & 0xffffffff; 0 < (int)(uint)uVar11; uVar11 = uVar11 - 1) {
              if ((0x20 < (ulong)(byte)expr[uVar11 - 1]) ||
                 ((0x100002600U >> ((ulong)(byte)expr[uVar11 - 1] & 0x3f) & 1) == 0)) {
                expr[(uint)uVar11 & 0x7fffffff] = '\0';
                bVar10 = expr[1] ^ 0x20;
                if ((cVar1 == 't' && bVar10 == 0) && lVar5 != 0) {
                  ptr = expr + 2;
                  local_3340 = lVar5;
                  iVar2 = scanNumber(&ptr);
                  if (*ptr == ' ') {
                    pxVar12 = (xmlAutomataStatePtr)(long)iVar2;
                    pxVar8 = states[(long)pxVar12];
                    if (pxVar8 == (xmlAutomataStatePtr)0x0) {
                      pxVar8 = (xmlAutomataStatePtr)xmlAutomataNewState(local_3340);
                      states[(long)pxVar12] = pxVar8;
                    }
                    ptr = ptr + 1;
                    iVar2 = scanNumber(&ptr);
                    lVar5 = local_3340;
                    if (*ptr == ' ') {
                      pxVar9 = states[iVar2];
                      local_3318 = pxVar12;
                      if (pxVar9 == (xmlAutomataStatePtr)0x0) {
                        pxVar9 = (xmlAutomataStatePtr)xmlAutomataNewState(local_3340,pxVar8);
                        states[iVar2] = pxVar9;
                        pxVar8 = states[(long)local_3318];
                      }
                      ptr = ptr + 1;
                      xmlAutomataNewTransition(lVar5,pxVar8,pxVar9,ptr,0);
                      goto LAB_0010b6eb;
                    }
                  }
                  fprintf(_stderr,"Bad line %s\n",expr);
                  lVar5 = local_3340;
                  goto LAB_0010bd0a;
                }
                if ((cVar1 == 'e' && bVar10 == 0) && lVar5 != 0) {
                  ptr = expr + 2;
                  iVar2 = scanNumber(&ptr);
                  if (*ptr == ' ') {
                    local_3340 = (long)iVar2;
                    pxVar8 = states[local_3340];
                    if (pxVar8 == (xmlAutomataStatePtr)0x0) {
                      pxVar8 = (xmlAutomataStatePtr)xmlAutomataNewState(lVar5);
                      states[local_3340] = pxVar8;
                    }
                    ptr = ptr + 1;
                    iVar2 = scanNumber(&ptr);
                    pxVar12 = states[iVar2];
                    if (pxVar12 == (xmlAutomataStatePtr)0x0) {
                      pxVar12 = (xmlAutomataStatePtr)xmlAutomataNewState(lVar5);
                      states[iVar2] = pxVar12;
                      pxVar8 = states[local_3340];
                    }
                    xmlAutomataNewEpsilon(lVar5,pxVar8,pxVar12);
                    goto LAB_0010b6eb;
                  }
                }
                else {
                  if ((cVar1 == 'f' && bVar10 == 0) && lVar5 != 0) {
                    ptr = expr + 2;
                    uVar3 = scanNumber(&ptr);
                    if (states[(int)uVar3] != (xmlAutomataStatePtr)0x0) {
                      xmlAutomataSetFinalState(lVar5);
                      goto LAB_0010b6eb;
                    }
                    fprintf(_stderr,"Bad state %d : %s\n",(ulong)uVar3,expr);
                    goto LAB_0010bd0a;
                  }
                  if ((cVar1 != 'c' || bVar10 != 0) || lVar5 == 0) {
                    if ((expr[1] == '-' && cVar1 == '-') && lVar5 != 0) {
                      lVar13 = xmlAutomataCompile(lVar5);
                      xmlFreeAutomata(lVar5);
                      lVar5 = 0;
                      local_3348 = lVar13;
                      if (lVar13 != 0) goto LAB_0010b6eb;
                      fwrite("Failed to compile the automata",0x1e,1,_stderr);
                      local_3348 = 0;
                      lVar5 = 0;
                      goto LAB_0010bd0a;
                    }
                    if (expr[1] != '>' || cVar1 != '=') {
                      if (local_3348 == 0) {
                        fprintf(_stderr,"Unexpected line %s\n",expr);
                        local_3348 = 0;
                      }
                      else {
                        if (local_3330 == 0) {
                          local_3330 = xmlRegNewExecCtxt(local_3348,0,0);
                        }
                        local_3320 = xmlRegExecPushString(local_3330,expr,0);
                      }
                      goto LAB_0010b6eb;
                    }
                    if (local_3348 == 0) {
                      fwrite("=> failed not compiled\n",0x17,1,local_3328);
                      goto LAB_0010b6d9;
                    }
                    lVar13 = local_3330;
                    if (local_3330 == 0) {
                      lVar13 = xmlRegNewExecCtxt(local_3348,0,0);
                    }
                    iVar2 = (int)local_3320;
                    if (iVar2 == 0) {
                      iVar2 = xmlRegExecPushString(lVar13,0,0);
                    }
                    if (iVar2 == 1) {
                      pcVar6 = "=> Passed\n";
LAB_0010bb8f:
                      sStackY_3360 = 10;
LAB_0010bb91:
                      fwrite(pcVar6,sStackY_3360,1,local_3328);
                    }
                    else {
                      if (iVar2 + 1U < 2) {
                        pcVar6 = "=> Failed\n";
                        goto LAB_0010bb8f;
                      }
                      if (iVar2 < 0) {
                        pcVar6 = "=> Error\n";
                        sStackY_3360 = 9;
                        goto LAB_0010bb91;
                      }
                    }
                    xmlRegFreeExecCtxt(lVar13);
                    local_3330 = 0;
                    goto LAB_0010b6e2;
                  }
                  ptr = expr + 2;
                  iVar2 = scanNumber(&ptr);
                  if (*ptr == ' ') {
                    lVar13 = (long)iVar2;
                    if (states[lVar13] == (xmlAutomataStatePtr)0x0) {
                      pxVar8 = (xmlAutomataStatePtr)xmlAutomataNewState(lVar5);
                      states[lVar13] = pxVar8;
                    }
                    ptr = ptr + 1;
                    local_3340 = lVar13;
                    iVar2 = scanNumber(&ptr);
                    if (*ptr != ' ') goto LAB_0010bc9d;
                    pxVar8 = states[iVar2];
                    if (pxVar8 == (xmlAutomataStatePtr)0x0) {
                      pxVar8 = (xmlAutomataStatePtr)xmlAutomataNewState(lVar5);
                      states[iVar2] = pxVar8;
                    }
                    ptr = ptr + 1;
                    local_3318 = pxVar8;
                    iVar2 = scanNumber(&ptr);
                    if (*ptr == ' ') {
                      ptr = ptr + 1;
                      iVar4 = scanNumber(&ptr);
                      if (*ptr == ' ') {
                        ptr = ptr + 1;
                        xmlAutomataNewCountTrans
                                  (lVar5,states[local_3340],local_3318,ptr,iVar2,iVar4,0);
                        goto LAB_0010b6eb;
                      }
                    }
                  }
                }
LAB_0010bc9d:
                fprintf(_stderr,"Bad line %s\n",expr);
                goto LAB_0010bd0a;
              }
              pcVar6 = pcVar6 + -1;
            }
            *pcVar6 = '\0';
          } while( true );
        }
        fwrite("Cannot get start state\n",0x17,1,_stderr);
        xmlFreeAutomata(lVar5);
      }
      fclose(__stream);
    }
  }
  return -1;
}

Assistant:

static int
automataTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED, int options ATTRIBUTE_UNUSED) {
    FILE *input, *output;
    char *temp;
    char expr[5000];
    int len;
    int ret;
    int i;
    int res = 0;
    xmlAutomataPtr am;
    xmlAutomataStatePtr states[1000];
    xmlRegexpPtr regexp = NULL;
    xmlRegExecCtxtPtr exec = NULL;

    nb_tests++;

    for (i = 0;i<1000;i++)
	states[i] = NULL;

    input = fopen(filename, "rb");
    if (input == NULL) {
        fprintf(stderr,
		"Cannot open %s for reading\n", filename);
	return(-1);
    }
    temp = resultFilename(filename, "", ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    output = fopen(temp, "wb");
    if (output == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        free(temp);
	return(-1);
    }

    am = xmlNewAutomata();
    if (am == NULL) {
        fprintf(stderr,
		"Cannot create automata\n");
	fclose(input);
	return(-1);
    }
    states[0] = xmlAutomataGetInitState(am);
    if (states[0] == NULL) {
        fprintf(stderr,
		"Cannot get start state\n");
	xmlFreeAutomata(am);
	fclose(input);
	return(-1);
    }
    ret = 0;

    while (fgets(expr, 4500, input) != NULL) {
	if (expr[0] == '#')
	    continue;
	len = strlen(expr);
	len--;
	while ((len >= 0) &&
	       ((expr[len] == '\n') || (expr[len] == '\t') ||
		(expr[len] == '\r') || (expr[len] == ' '))) len--;
	expr[len + 1] = 0;
	if (len >= 0) {
	    if ((am != NULL) && (expr[0] == 't') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		ptr++;
		xmlAutomataNewTransition(am, states[from], states[to],
			                 BAD_CAST ptr, NULL);
	    } else if ((am != NULL) && (expr[0] == 'e') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		xmlAutomataNewEpsilon(am, states[from], states[to]);
	    } else if ((am != NULL) && (expr[0] == 'f') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int state;

		state = scanNumber(&ptr);
		if (states[state] == NULL) {
		    fprintf(stderr,
			    "Bad state %d : %s\n", state, expr);
		    break;
		}
		xmlAutomataSetFinalState(am, states[state]);
	    } else if ((am != NULL) && (expr[0] == 'c') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;
		int min, max;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		ptr++;
		min = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		ptr++;
		max = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		ptr++;
		xmlAutomataNewCountTrans(am, states[from], states[to],
			                 BAD_CAST ptr, min, max, NULL);
	    } else if ((am != NULL) && (expr[0] == '-') && (expr[1] == '-')) {
		/* end of the automata */
		regexp = xmlAutomataCompile(am);
		xmlFreeAutomata(am);
		am = NULL;
		if (regexp == NULL) {
		    fprintf(stderr,
			    "Failed to compile the automata");
		    break;
		}
	    } else if ((expr[0] == '=') && (expr[1] == '>')) {
		if (regexp == NULL) {
		    fprintf(output, "=> failed not compiled\n");
		} else {
		    if (exec == NULL)
			exec = xmlRegNewExecCtxt(regexp, NULL, NULL);
		    if (ret == 0) {
			ret = xmlRegExecPushString(exec, NULL, NULL);
		    }
		    if (ret == 1)
			fprintf(output, "=> Passed\n");
		    else if ((ret == 0) || (ret == -1))
			fprintf(output, "=> Failed\n");
		    else if (ret < 0)
			fprintf(output, "=> Error\n");
		    xmlRegFreeExecCtxt(exec);
		    exec = NULL;
		}
		ret = 0;
	    } else if (regexp != NULL) {
		if (exec == NULL)
		    exec = xmlRegNewExecCtxt(regexp, NULL, NULL);
		ret = xmlRegExecPushString(exec, BAD_CAST expr, NULL);
	    } else {
		fprintf(stderr,
			"Unexpected line %s\n", expr);
	    }
	}
    }
    fclose(output);
    fclose(input);
    if (regexp != NULL)
	xmlRegFreeRegexp(regexp);
    if (exec != NULL)
	xmlRegFreeExecCtxt(exec);
    if (am != NULL)
	xmlFreeAutomata(am);

    ret = compareFiles(temp, result);
    if (ret) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
        res = 1;
    }
    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    return(res);
}